

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

bool __thiscall
MlmWrap::isHfTypeCurrentlySubbed(MlmWrap *this,string *dataName,string *moduleOrigin)

{
  __type _Var1;
  ulong uVar2;
  reference obj;
  size_type __n;
  HighFreqDataType curType;
  string local_100;
  string local_e0;
  HighFreqDataType local_c0;
  
  for (__n = 0; uVar2 = ((long)(this->subbedHfDataTypes).
                               super__Vector_base<HFSubSockSettings,_std::allocator<HFSubSockSettings>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->subbedHfDataTypes).
                              super__Vector_base<HFSubSockSettings,_std::allocator<HFSubSockSettings>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0xa8, __n < uVar2;
      __n = __n + 1) {
    obj = std::vector<HFSubSockSettings,_std::allocator<HFSubSockSettings>_>::at
                    (&this->subbedHfDataTypes,__n);
    HighFreqDataType::HighFreqDataType(&local_c0,&obj->dataType);
    HighFreqDataType::getName_abi_cxx11_(&local_100,&local_c0);
    _Var1 = std::operator==(dataName,&local_100);
    if (_Var1) {
      HighFreqDataType::getOrigin_abi_cxx11_(&local_e0,&local_c0);
      _Var1 = std::operator==(moduleOrigin,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      HighFreqDataType::~HighFreqDataType(&local_c0);
      if (_Var1) break;
    }
    else {
      std::__cxx11::string::~string((string *)&local_100);
      HighFreqDataType::~HighFreqDataType(&local_c0);
    }
  }
  return __n < uVar2;
}

Assistant:

bool MlmWrap::isHfTypeCurrentlySubbed(std::string dataName, std::string moduleOrigin) {
    for (size_t i = 0; i < subbedHfDataTypes.size(); i++) {
        HighFreqDataType curType = subbedHfDataTypes.at(i).dataType;
        if (dataName == curType.getName() && moduleOrigin == curType.getOrigin()) {
            return(true); //if the type is in the availHfDataTypes list
        }
    }

    return(false);
}